

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.hh
# Opt level: O2

bool __thiscall QPDFTokenizer::Token::operator==(Token *this,Token *rhs)

{
  __type_conflict _Var1;
  
  if ((*(int *)this != 0) && (*(int *)this == *(int *)rhs)) {
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (this + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (rhs + 8));
    return _Var1;
  }
  return false;
}

Assistant:

bool
        operator==(Token const& rhs) const
        {
            // Ignore fields other than type and value
            return (
                (this->type != tt_bad) && (this->type == rhs.type) && (this->value == rhs.value));
        }